

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [24],
          char **params_1,unsigned_long *params_2,unsigned_short *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  char **params_00;
  unsigned_long *params_01;
  unsigned_short *params_02;
  long lVar4;
  char **ppcVar5;
  ArrayPtr<kj::String> argValues_00;
  String argValues [4];
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  ppcVar5 = params_1;
  str<char_const(&)[24]>(&local_98,(kj *)macroArgs,(char (*) [24])macroArgs);
  str<char_const*&>(&local_80,(kj *)params,params_00);
  str<unsigned_long&>(&local_68,(kj *)params_1,params_01);
  str<unsigned_short&>(&local_50,(kj *)params_2,params_02);
  argValues_00.size_ = (size_t)ppcVar5;
  argValues_00.ptr = (String *)0x4;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)&local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}